

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall
CTcTokenizer::log_error_or_warning_with_tok
          (CTcTokenizer *this,tc_severity_t sev,int errnum,CTcToken *tok)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *p;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  byte *p_00;
  byte *pbVar9;
  bool bVar10;
  char buf [128];
  char *local_d0;
  char local_b8 [136];
  
  pcVar7 = "\'";
  switch(tok->typ_) {
  case TOKT_EOF:
    sVar3 = 0xd;
    pcVar7 = "<End Of File>";
    goto LAB_00253f4d;
  default:
    pcVar7 = tok->text_;
    sVar3 = tok->text_len_;
    goto LAB_00253f4d;
  case TOKT_DSTR:
    pcVar7 = "\"";
  case TOKT_SSTR:
    local_d0 = pcVar7;
    break;
  case TOKT_DSTR_START:
    local_d0 = "<<";
    pcVar7 = "\"";
    break;
  case TOKT_DSTR_MID:
    local_d0 = "<<";
    goto LAB_00253d55;
  case TOKT_DSTR_END:
    local_d0 = "\"";
LAB_00253d55:
    pcVar7 = ">>";
    break;
  case TOKT_RESTR:
    local_d0 = "\'";
    pcVar7 = "R\'";
  }
  strcpy(local_b8,pcVar7);
  pbVar9 = (byte *)tok->text_len_;
  sVar3 = strlen(local_b8);
  pcVar7 = local_b8 + sVar3;
  if (pbVar9 != (byte *)0x0) {
    p = pcVar7;
    uVar8 = 0;
    p_00 = (byte *)tok->text_;
    do {
      wVar1 = utf8_ptr::s_getch((char *)p_00);
      if (wVar1 < L' ') {
        *p = '\\';
        wVar1 = utf8_ptr::s_getch((char *)p_00);
        pcVar7 = p + 2;
        switch(wVar1) {
        case L'\t':
          p[1] = 't';
          break;
        case L'\n':
          p[1] = 'n';
          break;
        case L'\v':
          p[1] = 'b';
          break;
        default:
          p[1] = 'x';
          wVar1 = utf8_ptr::s_getch((char *)p_00);
          uVar2 = (uint)wVar1 >> 0xc & 0xf;
          iVar6 = uVar2 + 0x37;
          if (uVar2 < 10) {
            iVar6 = uVar2 + 0x30;
          }
          sVar4 = utf8_ptr::s_putch(pcVar7,iVar6 + L'0');
          pcVar7 = pcVar7 + sVar4;
          wVar1 = utf8_ptr::s_getch((char *)p_00);
          uVar2 = (uint)wVar1 >> 8 & 0xf;
          iVar6 = uVar2 + 0x37;
          if (uVar2 < 10) {
            iVar6 = uVar2 + 0x30;
          }
          sVar4 = utf8_ptr::s_putch(pcVar7,iVar6 + L'0');
          pcVar7 = pcVar7 + sVar4;
          wVar1 = utf8_ptr::s_getch((char *)p_00);
          uVar2 = (uint)wVar1 >> 4 & 0xf;
          iVar6 = uVar2 + 0x37;
          if (uVar2 < 10) {
            iVar6 = uVar2 + 0x30;
          }
          sVar4 = utf8_ptr::s_putch(pcVar7,iVar6 + L'0');
          wVar1 = utf8_ptr::s_getch((char *)p_00);
          uVar2 = wVar1 & 0xf;
          iVar6 = uVar2 + 0x37;
          if (uVar2 < 10) {
            iVar6 = uVar2 + 0x30;
          }
          sVar5 = utf8_ptr::s_putch(pcVar7 + sVar4,iVar6 + L'0');
          pcVar7 = pcVar7 + sVar4 + sVar5;
          break;
        case L'\r':
          p[1] = 'r';
          break;
        case L'\x0e':
          p[1] = 'v';
          break;
        case L'\x0f':
          p[1] = '^';
          break;
        case L'\x15':
          p[1] = ' ';
        }
      }
      else {
        wVar1 = utf8_ptr::s_getch((char *)p_00);
        sVar4 = utf8_ptr::s_putch(p,wVar1);
        pcVar7 = p + sVar4;
      }
      pbVar9 = p_00 + ((long)pbVar9 -
                      (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) +
                                    1));
    } while ((pbVar9 != (byte *)0x0) &&
            (bVar10 = uVar8 < 0x13, p = pcVar7, uVar8 = uVar8 + 1,
            p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1, bVar10)
            );
    if (pbVar9 != (byte *)0x0) {
      pcVar7[0] = '.';
      pcVar7[1] = '.';
      pcVar7[2] = '.';
      pcVar7 = pcVar7 + 3;
    }
  }
  strcpy(pcVar7,local_d0);
  pcVar7 = local_b8;
  sVar3 = strlen(pcVar7);
LAB_00253f4d:
  CTcMain::log_error(G_tcmain,this->last_desc_,this->last_linenum_,sev,errnum,sVar3,pcVar7);
  return;
}

Assistant:

void CTcTokenizer::log_error_or_warning_with_tok(
    tc_severity_t sev, int errnum, const CTcToken *tok)
{
    const char *tok_txt;
    size_t tok_len;
    char buf[128];
    const char *prefix;
    const char *suffix;
    utf8_ptr src;
    utf8_ptr dst;
    size_t rem;
    size_t outchars;

    /* see what we have */
    switch(tok->gettyp())
    {
    case TOKT_SSTR:
        /* show the string in quotes, but limit the length */
        prefix = "'";
        suffix = "'";
        goto format_string;

    case TOKT_DSTR:
        prefix = "\"";
        suffix = "\"";
        goto format_string;
        
    case TOKT_DSTR_START:
        prefix = "\"";
        suffix = "<<";
        goto format_string;
        
    case TOKT_DSTR_MID:
        prefix = ">>";
        suffix = "<<";
        goto format_string;

    case TOKT_DSTR_END:
        prefix = ">>";
        suffix = "\"";
        goto format_string;

    case TOKT_RESTR:
        prefix = "R'";
        suffix = "'";
        goto format_string;

    format_string:
        /* set the prefix */
        strcpy(buf, prefix);
        
        /* 
         *   show the string, but limit the length, and convert control
         *   characters to escaped representation 
         */
        src.set((char *)tok->get_text());
        rem = tok->get_text_len();
        for (dst.set(buf  + strlen(buf)), outchars = 0 ;
             rem != 0 && outchars < 20 ; src.inc(&rem), ++outchars)
        {
            /* if this is a control character, escape it */
            if (src.getch() < 32)
            {
                dst.setch('\\');
                
                switch(src.getch())
                {
                case 10:
                    dst.setch('n');
                    break;

                case 13:
                    dst.setch('r');
                    break;

                case 0x000F:
                    dst.setch('^');
                    break;

                case 0x000E:
                    dst.setch('v');
                    break;

                case 0x000B:
                    dst.setch('b');
                    break;

                case 0x0015:
                    dst.setch(' ');
                    break;

                case 9:
                    dst.setch('t');
                    break;

                default:
                    dst.setch('x');
                    dst.setch('0' + int_to_xdigit((src.getch() >> 12) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 8) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 4) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch()) & 0xf));
                    break;
                }
            }
            else
            {
                /* put this character as-is */
                dst.setch(src.getch());
            }
        }

        /* if there's more string left, add "..." */
        if (rem != 0)
        {
            dst.setch('.');
            dst.setch('.');
            dst.setch('.');
        }

        /* add the suffix */
        strcpy(dst.getptr(), suffix);

        /* use this buffer as the token string to display */
        tok_txt = buf;
        tok_len = strlen(tok_txt);
        break;

    case TOKT_EOF:
        /* show a special "<End Of File>" marker */
        tok_txt = "<End Of File>";
        tok_len = strlen(tok_txt);
        break;
        
    default:
        /* just show the current token text */
        tok_txt = tok->get_text();
        tok_len = tok->get_text_len();
        break;
    }
    
    /* log the error */
    G_tcmain->log_error(get_last_desc(), get_last_linenum(),
                        sev, errnum, tok_len, tok_txt);
}